

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  PositionType *pPVar1;
  cmMakefile *this_00;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  auto_ptr<cmCompiledGeneratorExpression> local_140;
  auto_ptr<cmCompiledGeneratorExpression> local_138;
  undefined1 local_130 [24];
  auto_ptr<cmCompiledGeneratorExpression> conditionCge;
  cmGeneratorExpression conditionGe;
  auto_ptr<cmCompiledGeneratorExpression> local_c8;
  auto_ptr<cmCompiledGeneratorExpression> outputCge;
  undefined1 local_b0 [8];
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  bool inputIsContent_local;
  string *condition_local;
  string *outputExpr_local;
  string *inputName_local;
  cmFileCommand *this_local;
  
  pPVar1 = &outputGe.Backtrace.Snapshot.Position.Position;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)pPVar1,(this->super_cmCommand).Makefile);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_b0,(cmListFileBacktrace *)pPVar1);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)&conditionGe.Backtrace.Snapshot.Position.Position,
             (string *)local_b0);
  pPVar1 = &conditionGe.Backtrace.Snapshot.Position.Position;
  r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)pPVar1);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_c8,r);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)pPVar1);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&conditionCge,
             (cmListFileBacktrace *)&outputGe.Backtrace.Snapshot.Position.Position);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_130,(string *)&conditionCge);
  local_130._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_130);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_130 + 0x10),
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_130._8_8_);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_130);
  this_00 = (this->super_cmCommand).Makefile;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_138,&local_c8);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_140,(auto_ptr<cmCompiledGeneratorExpression> *)(local_130 + 0x10));
  cmMakefile::AddEvaluationFile(this_00,inputName,&local_138,&local_140,inputIsContent);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_140);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_138);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_130 + 0x10));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&conditionCge);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_c8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_b0);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)&outputGe.Backtrace.Snapshot.Position.Position);
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string &inputName,
                                      const std::string &outputExpr,
                                      const std::string &condition,
                                      bool inputIsContent
                                     )
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> outputCge
                                                = outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> conditionCge
                                              = conditionGe.Parse(condition);

  this->Makefile->AddEvaluationFile(inputName, outputCge,
                                    conditionCge, inputIsContent);
}